

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O2

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  void *pvVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  void *pvVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  void *pvVar35;
  int i_1;
  int iVar36;
  int iw_1;
  int iVar37;
  int iVar38;
  int j;
  long lVar39;
  int iVar40;
  int l;
  int i_2;
  int iVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  int ki;
  int iVar45;
  int iVar46;
  float fVar47;
  void *local_1e0;
  void *local_1d0;
  void *local_1c0;
  void *local_1a8;
  void *local_1a0;
  void *local_190;
  void *local_180;
  allocator_type local_161;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  int local_140;
  undefined4 uStack_13c;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  Mat local_108;
  void *local_b8;
  long local_b0;
  void *local_a8;
  long local_a0;
  ulong local_98;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  
  iVar27 = bottom_blob->w;
  iVar42 = bottom_blob->h;
  iVar43 = bottom_blob->d;
  uVar3 = bottom_blob->c;
  uVar15 = (ulong)uVar3;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_108.cstep = 0;
      local_108.data = (void *)0x0;
      local_108.refcount._0_4_ = 0;
      local_108.refcount._4_4_ = 0;
      local_108.elemsize._0_4_ = 0;
      local_108.elemsize._4_4_ = 0;
      local_108.elempack = 0;
      local_108.allocator = (Allocator *)0x0;
      local_108.dims = 0;
      local_108.w = 0;
      local_108.h = 0;
      local_108.d = 0;
      local_108.c = 0;
      opt_pad.lightmode = opt->lightmode;
      opt_pad._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_pad.num_threads = opt->num_threads;
      opt_pad.blob_allocator = opt->blob_allocator;
      opt_pad.workspace_allocator = opt->workspace_allocator;
      opt_pad.openmp_blocktime = opt->openmp_blocktime;
      opt_pad.use_winograd_convolution = opt->use_winograd_convolution;
      opt_pad.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_pad.use_int8_inference = opt->use_int8_inference;
      opt_pad.use_vulkan_compute = opt->use_vulkan_compute;
      uVar20._0_1_ = opt->use_bf16_storage;
      uVar20._1_1_ = opt->use_fp16_packed;
      uVar20._2_1_ = opt->use_fp16_storage;
      uVar20._3_1_ = opt->use_fp16_arithmetic;
      uVar20._4_1_ = opt->use_int8_packed;
      uVar20._5_1_ = opt->use_int8_storage;
      uVar20._6_1_ = opt->use_int8_arithmetic;
      uVar20._7_1_ = opt->use_packing_layout;
      opt_pad.use_shader_pack8 = opt->use_shader_pack8;
      opt_pad.use_subgroup_basic = opt->use_subgroup_basic;
      opt_pad.use_subgroup_vote = opt->use_subgroup_vote;
      opt_pad.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_pad.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_pad.use_image_storage = opt->use_image_storage;
      opt_pad.use_tensor_storage = opt->use_tensor_storage;
      opt_pad.use_reserved_0 = opt->use_reserved_0;
      opt_pad.flush_denormals = opt->flush_denormals;
      opt_pad.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_pad.use_shader_local_memory = opt->use_shader_local_memory;
      opt_pad.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_pad.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_pad.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_pad.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_pad.use_reserved_6 = opt->use_reserved_6;
      opt_pad.use_reserved_7 = opt->use_reserved_7;
      opt_pad.use_reserved_8 = opt->use_reserved_8;
      opt_pad.use_reserved_9 = opt->use_reserved_9;
      opt_pad.use_reserved_10 = opt->use_reserved_10;
      opt_pad.use_reserved_11 = opt->use_reserved_11;
      opt_pad._32_8_ = uVar20 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_108,&opt_pad);
      iVar43 = local_108.h;
      iVar42 = local_108.w;
      iVar27 = -100;
      if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
        iVar31 = local_108.d;
        iVar36 = (local_108.w - this->kernel_w) / this->stride_w;
        iVar19 = (local_108.h - this->kernel_h) / this->stride_h;
        iVar26 = iVar36 + 1;
        iVar4 = (local_108.d - this->kernel_d) / this->stride_d;
        Mat::create(top_blob,iVar26,iVar19 + 1,iVar4 + 1,uVar3,sVar5,(Allocator *)0x0);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar20 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar20,&local_161);
          iVar27 = this->kernel_w;
          iVar12 = this->kernel_h;
          iVar38 = iVar43 - iVar12;
          iVar37 = iVar42 - iVar27;
          iVar13 = 0;
          iVar46 = 0;
          for (iVar23 = 0; iVar23 < this->kernel_d; iVar23 = iVar23 + 1) {
            for (iVar14 = 0; iVar14 < iVar12; iVar14 = iVar14 + 1) {
              for (lVar21 = 0; iVar12 = (int)lVar21, iVar12 < iVar27; lVar21 = lVar21 + 1) {
                _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar13 + lVar21] = iVar12 + iVar46;
                iVar27 = this->kernel_w;
              }
              iVar13 = iVar13 + iVar12;
              iVar46 = iVar46 + iVar37 + iVar12;
              iVar12 = this->kernel_h;
            }
            iVar46 = iVar46 + iVar38 * iVar42;
          }
          lVar21 = (long)iVar26;
          lVar30 = (long)iVar36;
          iVar27 = (int)uVar20;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar27 = 0;
              iVar36 = 0;
              iVar26 = 0;
              if (this->pad_mode == 0) {
                iVar27 = (bottom_blob->w - local_108.w) + this->pad_left + this->pad_right;
                iVar36 = (bottom_blob->h - local_108.h) + this->pad_top + this->pad_bottom;
                iVar26 = (bottom_blob->d - local_108.d) + this->pad_front + this->pad_behind;
              }
              local_b8 = local_108.data;
              iVar36 = iVar36 + iVar43;
              local_a0 = top_blob->cstep * top_blob->elemsize;
              local_a8 = top_blob->data;
              local_150 = (long)iVar19;
              local_160 = (long)iVar4;
              if ((int)uVar3 < 1) {
                uVar15 = 0;
              }
              local_b0 = local_108.cstep *
                         CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              lVar16 = (long)local_108.w *
                       CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              _local_140 = CONCAT44(uStack_13c,iVar36);
              uVar20 = 0;
              while (uVar28 = uVar20, uVar28 != uVar15) {
                local_1a8 = (void *)(local_a0 * uVar28 + (long)local_a8);
                local_110 = (long)this->stride_d;
                local_118 = local_108.h * lVar16 * local_110;
                local_190 = local_b8;
                lVar39 = 0;
                while (lVar17 = lVar39, lVar17 <= local_160) {
                  local_158 = (long)this->stride_h;
                  local_180 = local_190;
                  lVar39 = 0;
                  while (lVar22 = lVar39, lVar22 <= local_150) {
                    local_130 = (long)this->stride_w;
                    uVar3 = this->kernel_d;
                    if (this->kernel_d < 1) {
                      uVar3 = 0;
                    }
                    local_138 = local_130 * 4;
                    lVar24 = 0;
                    local_1e0 = local_180;
                    lVar39 = 0;
                    while (lVar34 = lVar39, lVar34 <= lVar30) {
                      uVar20 = 0;
                      uVar25 = this->kernel_w;
                      if (this->kernel_w < 1) {
                        uVar25 = 0;
                      }
                      uVar9 = this->kernel_h;
                      if (this->kernel_h < 1) {
                        uVar9 = 0;
                      }
                      fVar47 = 0.0;
                      local_1c0 = local_1e0;
                      iVar43 = 0;
                      for (; uVar20 != uVar3; uVar20 = uVar20 + 1) {
                        lVar39 = uVar20 + lVar17 * local_110;
                        if (this->pad_front <= lVar39) {
                          if ((iVar26 + iVar31) - this->pad_behind <= lVar39) break;
                          pvVar35 = local_1c0;
                          for (uVar32 = 0; uVar32 != uVar9; uVar32 = uVar32 + 1) {
                            lVar39 = uVar32 + lVar22 * local_158;
                            if (this->pad_top <= lVar39) {
                              if (iVar36 - this->pad_bottom <= lVar39) break;
                              for (uVar44 = 0; uVar25 != uVar44; uVar44 = uVar44 + 1) {
                                if ((long)this->pad_left <= (long)(uVar44 + lVar24)) {
                                  if ((long)((iVar27 + iVar42) - this->pad_right) <=
                                      (long)(uVar44 + lVar24)) break;
                                  fVar47 = fVar47 + *(float *)((long)pvVar35 + uVar44 * 4);
                                  iVar43 = iVar43 + 1;
                                }
                              }
                            }
                            pvVar35 = (void *)((long)pvVar35 + lVar16);
                          }
                        }
                        local_1c0 = (void *)((long)local_1c0 + local_108.h * lVar16);
                      }
                      *(float *)((long)local_1a8 + lVar34 * 4) = fVar47 / (float)iVar43;
                      local_1e0 = (void *)((long)local_1e0 + local_138);
                      lVar24 = lVar24 + local_130;
                      local_128 = lVar34;
                      lVar39 = lVar34 + 1;
                    }
                    local_1a8 = (void *)((long)local_1a8 + lVar21 * 4);
                    local_180 = (void *)((long)local_180 + lVar16 * local_158);
                    local_148 = lVar22;
                    lVar39 = lVar22 + 1;
                  }
                  local_190 = (void *)((long)local_190 + local_118);
                  local_120 = lVar17;
                  lVar39 = lVar17 + 1;
                }
                local_b8 = (void *)((long)local_b8 + local_b0);
                local_98 = uVar28;
                uVar20 = uVar28 + 1;
              }
            }
            else {
              pvVar35 = top_blob->data;
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              lVar16 = (long)local_108.w *
                       CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              uVar28 = 0;
              uVar20 = uVar20 & 0xffffffff;
              if (iVar27 < 1) {
                uVar20 = uVar28;
              }
              if ((int)uVar3 < 1) {
                uVar15 = uVar28;
              }
              for (; uVar28 != uVar15; uVar28 = uVar28 + 1) {
                pvVar18 = (void *)(sVar5 * sVar6 * uVar28 + (long)pvVar35);
                for (iVar42 = 0; iVar42 <= iVar4; iVar42 = iVar42 + 1) {
                  for (iVar43 = 0; iVar43 <= iVar19; iVar43 = iVar43 + 1) {
                    iVar36 = this->stride_d;
                    iVar31 = this->stride_h;
                    iVar26 = this->stride_w;
                    for (lVar39 = 0; lVar39 <= lVar30; lVar39 = lVar39 + 1) {
                      fVar47 = 0.0;
                      for (uVar32 = 0; uVar20 != uVar32; uVar32 = uVar32 + 1) {
                        fVar47 = fVar47 + *(float *)((long)local_108.data +
                                                    (long)_space_ofs.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar32] *
                                                  4 + lVar39 * iVar26 * 4 +
                                                      (long)iVar43 * (long)iVar31 * lVar16 +
                                                      (long)iVar36 * (long)iVar42 *
                                                      local_108.h * lVar16 +
                                                      local_108.cstep *
                                                      CONCAT44(local_108.elemsize._4_4_,
                                                               (undefined4)local_108.elemsize) *
                                                      uVar28);
                      }
                      *(float *)((long)pvVar18 + lVar39 * 4) = fVar47 * (1.0 / (float)iVar27);
                    }
                    pvVar18 = (void *)((long)pvVar18 + lVar21 * 4);
                  }
                }
              }
            }
          }
          else if (this->pooling_type == 0) {
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            lVar16 = (long)local_108.w *
                     CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            uVar28 = 0;
            uVar20 = uVar20 & 0xffffffff;
            if (iVar27 < 1) {
              uVar20 = uVar28;
            }
            pvVar35 = top_blob->data;
            if ((int)uVar3 < 1) {
              uVar15 = uVar28;
            }
            for (; uVar28 != uVar15; uVar28 = uVar28 + 1) {
              pvVar18 = (void *)(sVar5 * sVar6 * uVar28 + (long)pvVar35);
              for (iVar27 = 0; iVar27 <= iVar4; iVar27 = iVar27 + 1) {
                for (iVar42 = 0; iVar42 <= iVar19; iVar42 = iVar42 + 1) {
                  iVar43 = this->stride_d;
                  iVar36 = this->stride_h;
                  iVar31 = this->stride_w;
                  for (lVar39 = 0; lVar39 <= lVar30; lVar39 = lVar39 + 1) {
                    pfVar1 = (float *)((long)local_108.data +
                                      lVar39 * iVar31 * 4 +
                                      (long)iVar42 * (long)iVar36 * lVar16 +
                                      (long)iVar43 * (long)iVar27 * local_108.h * lVar16 +
                                      local_108.cstep *
                                      CONCAT44(local_108.elemsize._4_4_,
                                               (undefined4)local_108.elemsize) * uVar28);
                    fVar47 = *pfVar1;
                    for (uVar32 = 0; uVar20 != uVar32; uVar32 = uVar32 + 1) {
                      fVar2 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar32]];
                      if (fVar47 <= fVar2) {
                        fVar47 = fVar2;
                      }
                    }
                    *(float *)((long)pvVar18 + lVar39 * 4) = fVar47;
                  }
                  pvVar18 = (void *)((long)pvVar18 + lVar21 * 4);
                }
              }
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
          iVar27 = 0;
        }
      }
      piVar11 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
      if (piVar11 == (int *)0x0) {
        return iVar27;
      }
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 != 0) {
        return iVar27;
      }
      if (local_108.allocator != (Allocator *)0x0) {
        (*(local_108.allocator)->_vptr_Allocator[3])();
        return iVar27;
      }
      free(local_108.data);
      return iVar27;
    }
    Mat::create(top_blob,this->out_w,this->out_h,this->out_d,uVar3,sVar5,opt->blob_allocator);
    pvVar35 = top_blob->data;
    if (pvVar35 == (void *)0x0) {
      return -100;
    }
    sVar5 = top_blob->cstep;
    if ((long)top_blob->c * sVar5 == 0) {
      return -100;
    }
    if (this->pooling_type == 0) {
      sVar6 = bottom_blob->cstep;
      sVar7 = bottom_blob->elemsize;
      sVar8 = top_blob->elemsize;
      iVar36 = this->out_d;
      iVar19 = 0;
      if (0 < iVar36) {
        iVar19 = iVar36;
      }
      pvVar18 = bottom_blob->data;
      if ((int)uVar3 < 1) {
        uVar15 = 0;
      }
      for (uVar20 = 0; uVar20 != uVar15; uVar20 = uVar20 + 1) {
        lVar21 = sVar6 * sVar7 * uVar20;
        local_1a0 = (void *)(sVar5 * sVar8 * uVar20 + (long)pvVar35);
        iVar4 = this->out_h;
        iVar26 = 0;
        iVar31 = 0;
        if (0 < iVar4) {
          iVar31 = iVar4;
        }
        while (iVar26 != iVar19) {
          iVar38 = (iVar26 * iVar43) / iVar36;
          iVar26 = iVar26 + 1;
          uVar3 = this->out_w;
          iVar12 = 0;
          uVar28 = 0;
          if (0 < (int)uVar3) {
            uVar28 = (ulong)uVar3;
          }
          while (iVar12 != iVar31) {
            uVar32 = (long)(iVar12 * iVar42) / (long)iVar4;
            iVar12 = iVar12 + 1;
            uVar44 = 0;
            while (uVar44 != uVar28) {
              iVar37 = (iVar27 * (int)uVar44) / (int)uVar3;
              iVar46 = iVar37 + ((int)uVar32 + iVar38 * iVar42) * iVar27;
              fVar47 = *(float *)((long)pvVar18 + (long)iVar46 * 4 + lVar21);
              for (iVar13 = iVar38; iVar13 < (iVar26 * iVar43 + iVar36 + -1) / iVar36;
                  iVar13 = iVar13 + 1) {
                iVar23 = iVar46;
                for (uVar33 = uVar32 & 0xffffffff; lVar30 = (long)iVar37, iVar14 = iVar23,
                    (int)uVar33 < (iVar12 * iVar42 + iVar4 + -1) / iVar4;
                    uVar33 = (ulong)((int)uVar33 + 1)) {
                  for (; lVar30 < (int)((int)(uVar44 + 1) * iVar27 + (uVar3 - 1)) / (int)uVar3;
                      lVar30 = lVar30 + 1) {
                    fVar2 = *(float *)((long)pvVar18 + (long)iVar14 * 4 + lVar21);
                    if (fVar47 <= fVar2) {
                      fVar47 = fVar2;
                    }
                    iVar14 = iVar14 + 1;
                  }
                  iVar23 = iVar23 + iVar27;
                }
                iVar46 = iVar46 + iVar42 * iVar27;
              }
              *(float *)((long)local_1a0 + uVar44 * 4) = fVar47;
              uVar44 = uVar44 + 1;
            }
            local_1a0 = (void *)((long)local_1a0 + (long)(int)uVar3 * 4);
          }
        }
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      sVar6 = bottom_blob->cstep;
      sVar7 = bottom_blob->elemsize;
      sVar8 = top_blob->elemsize;
      iVar36 = this->out_d;
      iVar19 = 0;
      if (0 < iVar36) {
        iVar19 = iVar36;
      }
      pvVar18 = bottom_blob->data;
      if ((int)uVar3 < 1) {
        uVar15 = 0;
      }
      for (uVar20 = 0; uVar20 != uVar15; uVar20 = uVar20 + 1) {
        local_1d0 = (void *)(sVar5 * sVar8 * uVar20 + (long)pvVar35);
        iVar4 = this->out_h;
        iVar26 = 0;
        iVar31 = 0;
        if (0 < iVar4) {
          iVar31 = iVar4;
        }
        while (iVar26 != iVar19) {
          iVar37 = (iVar26 * iVar43) / iVar36;
          iVar26 = iVar26 + 1;
          iVar12 = (iVar26 * iVar43 + iVar36 + -1) / iVar36;
          uVar3 = this->out_w;
          iVar38 = 0;
          uVar28 = 0;
          if (0 < (int)uVar3) {
            uVar28 = (ulong)uVar3;
          }
          while (iVar38 != iVar31) {
            uVar32 = (long)(iVar38 * iVar42) / (long)iVar4;
            iVar38 = iVar38 + 1;
            iVar13 = (iVar38 * iVar42 + iVar4 + -1) / iVar4;
            iVar46 = (int)uVar32;
            uVar44 = 0;
            while (uVar44 != uVar28) {
              iVar40 = (iVar27 * (int)uVar44) / (int)uVar3;
              iVar14 = (int)((int)(uVar44 + 1) * iVar27 + (uVar3 - 1)) / (int)uVar3;
              iVar45 = (iVar46 + iVar37 * iVar42) * iVar27 + iVar40;
              fVar47 = 0.0;
              for (iVar23 = iVar37; iVar23 < iVar12; iVar23 = iVar23 + 1) {
                iVar41 = iVar45;
                for (uVar33 = uVar32 & 0xffffffff; lVar21 = (long)iVar40, iVar10 = iVar41,
                    (int)uVar33 < iVar13; uVar33 = (ulong)((int)uVar33 + 1)) {
                  for (; lVar21 < iVar14; lVar21 = lVar21 + 1) {
                    fVar47 = fVar47 + *(float *)((long)pvVar18 +
                                                (long)iVar10 * 4 + sVar6 * sVar7 * uVar20);
                    iVar10 = iVar10 + 1;
                  }
                  iVar41 = iVar41 + iVar27;
                }
                iVar45 = iVar45 + iVar42 * iVar27;
              }
              *(float *)((long)local_1d0 + uVar44 * 4) =
                   fVar47 / ((float)(iVar14 - iVar40) *
                            (float)(iVar13 - iVar46) * (float)(iVar12 - iVar37));
              uVar44 = uVar44 + 1;
            }
            local_1d0 = (void *)((long)local_1d0 + (long)(int)uVar3 * 4);
          }
        }
      }
      return 0;
    }
  }
  else {
    Mat::create(top_blob,uVar3,sVar5,opt->blob_allocator);
    pvVar35 = top_blob->data;
    if (pvVar35 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar25 = iVar42 * iVar27 * iVar43;
    if (this->pooling_type == 0) {
      pvVar18 = bottom_blob->data;
      lVar21 = bottom_blob->cstep * bottom_blob->elemsize;
      uVar20 = (ulong)uVar25;
      if ((int)uVar25 < 1) {
        uVar20 = 0;
      }
      if ((int)uVar3 < 1) {
        uVar15 = 0;
      }
      pvVar29 = pvVar18;
      for (uVar28 = 0; uVar28 != uVar15; uVar28 = uVar28 + 1) {
        fVar47 = *(float *)((long)pvVar18 + lVar21 * uVar28);
        for (uVar32 = 0; uVar20 != uVar32; uVar32 = uVar32 + 1) {
          fVar2 = *(float *)((long)pvVar29 + uVar32 * 4);
          if (fVar47 <= fVar2) {
            fVar47 = fVar2;
          }
        }
        *(float *)((long)pvVar35 + uVar28 * 4) = fVar47;
        pvVar29 = (void *)((long)pvVar29 + lVar21);
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      pvVar18 = bottom_blob->data;
      sVar5 = bottom_blob->cstep;
      uVar20 = (ulong)uVar25;
      if ((int)uVar25 < 1) {
        uVar20 = 0;
      }
      if ((int)uVar3 < 1) {
        uVar15 = 0;
      }
      sVar6 = bottom_blob->elemsize;
      for (uVar28 = 0; uVar28 != uVar15; uVar28 = uVar28 + 1) {
        fVar47 = 0.0;
        for (uVar32 = 0; uVar20 != uVar32; uVar32 = uVar32 + 1) {
          fVar47 = fVar47 + *(float *)((long)pvVar18 + uVar32 * 4);
        }
        *(float *)((long)pvVar35 + uVar28 * 4) = fVar47 * (1.0 / (float)(int)uVar25);
        pvVar18 = (void *)((long)pvVar18 + sVar5 * sVar6);
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}